

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

mbedtls_mpi_uint mpi_bigendian_to_host(mbedtls_mpi_uint a)

{
  mbedtls_mpi_uint a_local;
  
  return a >> 0x38 | (a & 0xff000000000000) >> 0x28 | (a & 0xff0000000000) >> 0x18 |
         (a & 0xff00000000) >> 8 | (a & 0xff000000) << 8 | (a & 0xff0000) << 0x18 |
         (a & 0xff00) << 0x28 | a << 0x38;
}

Assistant:

static mbedtls_mpi_uint mpi_bigendian_to_host(mbedtls_mpi_uint a)
{
    if (MBEDTLS_IS_BIG_ENDIAN) {
        /* Nothing to do on bigendian systems. */
        return a;
    } else {
#if defined(MBEDTLS_HAVE_INT32)
        return (mbedtls_mpi_uint) MBEDTLS_BSWAP32(a);
#elif defined(MBEDTLS_HAVE_INT64)
        return (mbedtls_mpi_uint) MBEDTLS_BSWAP64(a);
#endif
    }
}